

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

void __thiscall
spirv_cross::ParsedIR::make_constant_null
          (ParsedIR *this,uint32_t id,uint32_t type,bool add_to_typed_id_set)

{
  char *pcVar1;
  bool bVar2;
  Variant *pVVar3;
  size_t sVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  ID IVar7;
  uint32_t uVar8;
  SPIRType *pSVar9;
  SPIRConstant *pSVar10;
  long lVar11;
  undefined7 in_register_00000009;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  SmallVector<unsigned_int,_8UL> elements;
  undefined1 auStack_158 [15];
  bool local_149;
  undefined4 local_148;
  uint32_t local_144;
  ulong local_140;
  ID local_138;
  uint local_134;
  AlignedBuffer<unsigned_int,_8UL> *local_130;
  SmallVector<unsigned_int,_8UL> local_128 [4];
  undefined1 local_48 [16];
  undefined4 local_38;
  
  uVar13 = (ulong)id;
  local_144 = type;
  if ((this->ids).super_VectorView<spirv_cross::Variant>.buffer_size <= uVar13) {
    __assert_fail("id < ids.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                  ,0x40b,"void spirv_cross::ParsedIR::make_constant_null(uint32_t, uint32_t, bool)")
    ;
  }
  pSVar9 = Variant::get<spirv_cross::SPIRType>
                     ((this->ids).super_VectorView<spirv_cross::Variant>.ptr + type);
  if (pSVar9->pointer == true) {
    if (add_to_typed_id_set) {
      add_typed_id(this,TypeConstant,(ID)id);
    }
    pVVar3 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr + uVar13;
    pSVar10 = ObjectPool<spirv_cross::SPIRConstant>::allocate<unsigned_int&>
                        ((ObjectPool<spirv_cross::SPIRConstant> *)
                         pVVar3->group->pools[3]._M_t.
                         super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                         .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl,
                         &local_144);
    Variant::set(pVVar3,&pSVar10->super_IVariant,TypeConstant);
    (pSVar10->super_IVariant).self.id = id;
    memset(local_128,0,0xf8);
    lVar11 = 0x30;
    do {
      *(undefined1 (*) [16])((long)&local_138.id + lVar11) = (undefined1  [16])0x0;
      pcVar1 = local_128[0].stack_storage.aligned_char + lVar11 + -0x18;
      pcVar1[0] = '\x01';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      *(undefined1 (*) [16])(auStack_158 + lVar11) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&local_148 + lVar11) = (undefined1  [16])0x0;
      lVar11 = lVar11 + 0x38;
    } while (lVar11 != 0x110);
    local_48 = (undefined1  [16])0x0;
    local_38 = 1;
    memcpy(&pSVar10->m,local_128,0xf4);
    (pSVar10->m).columns = pSVar9->columns;
    uVar8 = pSVar9->vecsize;
    lVar11 = -0xe0;
    do {
      *(uint32_t *)((pSVar10->subconstants).stack_storage.aligned_char + lVar11 + -8) = uVar8;
      lVar11 = lVar11 + 0x38;
    } while (lVar11 != 0);
  }
  else {
    local_148 = (undefined4)CONCAT71(in_register_00000009,add_to_typed_id_set);
    local_140 = uVar13;
    if ((pSVar9->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      sVar4 = (pSVar9->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      if (sVar4 == 0) {
        if (add_to_typed_id_set) {
          add_typed_id(this,TypeConstant,(ID)id);
        }
        pVVar3 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr + uVar13;
        pSVar10 = ObjectPool<spirv_cross::SPIRConstant>::allocate<unsigned_int&>
                            ((ObjectPool<spirv_cross::SPIRConstant> *)
                             pVVar3->group->pools[3]._M_t.
                             super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                             .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>.
                             _M_head_impl,&local_144);
        Variant::set(pVVar3,&pSVar10->super_IVariant,TypeConstant);
        (pSVar10->super_IVariant).self.id = id;
        memset(local_128,0,0xf8);
        lVar11 = 0x30;
        do {
          *(undefined1 (*) [16])((long)&local_138.id + lVar11) = (undefined1  [16])0x0;
          pcVar1 = local_128[0].stack_storage.aligned_char + lVar11 + -0x18;
          pcVar1[0] = '\x01';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          *(undefined1 (*) [16])(auStack_158 + lVar11) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_148 + lVar11) = (undefined1  [16])0x0;
          lVar11 = lVar11 + 0x38;
        } while (lVar11 != 0x110);
        local_48 = (undefined1  [16])0x0;
        local_38 = 1;
        memcpy(&pSVar10->m,local_128,0xf4);
        (pSVar10->m).columns = pSVar9->columns;
        uVar8 = pSVar9->vecsize;
        lVar11 = -0xe0;
        do {
          *(uint32_t *)((pSVar10->subconstants).stack_storage.aligned_char + lVar11 + -8) = uVar8;
          lVar11 = lVar11 + 0x38;
        } while (lVar11 != 0);
        return;
      }
      local_138.id = id;
      uVar8 = increase_bound_by(this,(uint32_t)sVar4);
      local_128[0].super_VectorView<unsigned_int>.ptr = (uint *)&local_128[0].stack_storage;
      local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
      local_128[0].buffer_capacity = 8;
      SmallVector<unsigned_int,_8UL>::resize
                (local_128,
                 (pSVar9->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size);
      if ((pSVar9->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size != 0) {
        bVar2 = (bool)(char)local_148;
        uVar13 = 0;
        uVar12 = 1;
        do {
          make_constant_null(this,uVar8,
                             (pSVar9->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [uVar13].id,bVar2);
          *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar13 * 4) =
               uVar8;
          uVar8 = uVar8 + 1;
          bVar5 = uVar12 < (pSVar9->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size;
          uVar13 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar5);
      }
      IVar7.id = local_138.id;
      if ((char)local_148 != '\0') {
        add_typed_id(this,TypeConstant,local_138);
      }
      uVar13 = local_140;
      pVVar3 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr;
      local_130 = (AlignedBuffer<unsigned_int,_8UL> *)
                  local_128[0].super_VectorView<unsigned_int>.ptr;
      local_134 = (uint)local_128[0].super_VectorView<unsigned_int>.buffer_size;
      local_149 = false;
      pSVar10 = ObjectPool<spirv_cross::SPIRConstant>::
                allocate<unsigned_int&,unsigned_int*,unsigned_int,bool>
                          ((ObjectPool<spirv_cross::SPIRConstant> *)
                           (pVVar3[local_140].group)->pools[3]._M_t.
                           super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                           ,&local_144,(uint **)&local_130,&local_134,&local_149);
      Variant::set(pVVar3 + uVar13,&pSVar10->super_IVariant,TypeConstant);
      (pSVar10->super_IVariant).self.id = IVar7.id;
    }
    else {
      if ((pSVar9->parent_type).id == 0) {
        __assert_fail("constant_type.parent_type",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                      ,0x419,
                      "void spirv_cross::ParsedIR::make_constant_null(uint32_t, uint32_t, bool)");
      }
      uVar14 = 1;
      uVar8 = increase_bound_by(this,1);
      make_constant_null(this,uVar8,(pSVar9->parent_type).id,add_to_typed_id_set);
      bVar2 = (pSVar9->array_size_literal).super_VectorView<bool>.ptr
              [(pSVar9->array_size_literal).super_VectorView<bool>.buffer_size - 1];
      if (bVar2 == true) {
        uVar14 = (pSVar9->array).super_VectorView<unsigned_int>.ptr
                 [(pSVar9->array).super_VectorView<unsigned_int>.buffer_size - 1];
      }
      uVar13 = (ulong)uVar14;
      local_128[0].super_VectorView<unsigned_int>.ptr = (uint *)&local_128[0].stack_storage;
      local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
      local_128[0].buffer_capacity = 8;
      SmallVector<unsigned_int,_8UL>::resize(local_128,uVar13);
      auVar6 = _DAT_002c1e30;
      if (uVar14 != 0) {
        lVar11 = uVar13 - 1;
        auVar15._8_4_ = (int)lVar11;
        auVar15._0_8_ = lVar11;
        auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
        uVar12 = 0;
        auVar15 = auVar15 ^ _DAT_002c1e30;
        auVar17 = _DAT_002c1e10;
        auVar18 = _DAT_002c1e20;
        do {
          auVar19 = auVar18 ^ auVar6;
          iVar16 = auVar15._4_4_;
          if ((bool)(~(auVar19._4_4_ == iVar16 && auVar15._0_4_ < auVar19._0_4_ ||
                      iVar16 < auVar19._4_4_) & 1)) {
            *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar12) = uVar8;
          }
          if ((auVar19._12_4_ != auVar15._12_4_ || auVar19._8_4_ <= auVar15._8_4_) &&
              auVar19._12_4_ <= auVar15._12_4_) {
            *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar12 + 4) =
                 uVar8;
          }
          auVar19 = auVar17 ^ auVar6;
          iVar20 = auVar19._4_4_;
          if (iVar20 <= iVar16 && (iVar20 != iVar16 || auVar19._0_4_ <= auVar15._0_4_)) {
            *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar12 + 8) =
                 uVar8;
            *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar12 + 0xc) =
                 uVar8;
          }
          lVar11 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 4;
          auVar18._8_8_ = lVar11 + 4;
          lVar11 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 4;
          auVar17._8_8_ = lVar11 + 4;
          uVar12 = uVar12 + 0x10;
        } while ((uVar13 * 4 + 0xc & 0xfffffffffffffff0) != uVar12);
      }
      if ((char)local_148 != '\0') {
        add_typed_id(this,TypeConstant,(ID)id);
      }
      uVar13 = local_140;
      pVVar3 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr;
      local_130 = (AlignedBuffer<unsigned_int,_8UL> *)
                  local_128[0].super_VectorView<unsigned_int>.ptr;
      local_134 = (uint)local_128[0].super_VectorView<unsigned_int>.buffer_size;
      local_149 = false;
      pSVar10 = ObjectPool<spirv_cross::SPIRConstant>::
                allocate<unsigned_int&,unsigned_int*,unsigned_int,bool>
                          ((ObjectPool<spirv_cross::SPIRConstant> *)
                           (pVVar3[local_140].group)->pools[3]._M_t.
                           super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                           ,&local_144,(uint **)&local_130,&local_134,&local_149);
      Variant::set(pVVar3 + uVar13,&pSVar10->super_IVariant,TypeConstant);
      (pSVar10->super_IVariant).self.id = id;
      pSVar10->is_null_array_specialized_length = (bool)(bVar2 ^ 1);
    }
    local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_128[0].super_VectorView<unsigned_int>.ptr !=
        &local_128[0].stack_storage) {
      free(local_128[0].super_VectorView<unsigned_int>.ptr);
    }
  }
  return;
}

Assistant:

void ParsedIR::make_constant_null(uint32_t id, uint32_t type, bool add_to_typed_id_set)
{
	assert(id < ids.size());

	auto &constant_type = get<SPIRType>(type);

	if (constant_type.pointer)
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
	else if (!constant_type.array.empty())
	{
		assert(constant_type.parent_type);
		uint32_t parent_id = increase_bound_by(1);
		make_constant_null(parent_id, constant_type.parent_type, add_to_typed_id_set);

		// The array size of OpConstantNull can be either literal or specialization constant.
		// In the latter case, we cannot take the value as-is, as it can be changed to anything.
		// Rather, we assume it to be *one* for the sake of initializer.
		bool is_literal_array_size = constant_type.array_size_literal.back();
		uint32_t count = is_literal_array_size ? constant_type.array.back() : 1;

		SmallVector<uint32_t> elements(count);
		for (uint32_t i = 0; i < count; i++)
			elements[i] = parent_id;

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto& constant = variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false);
		constant.self = id;
		constant.is_null_array_specialized_length = !is_literal_array_size;
	}
	else if (!constant_type.member_types.empty())
	{
		uint32_t member_ids = increase_bound_by(uint32_t(constant_type.member_types.size()));
		SmallVector<uint32_t> elements(constant_type.member_types.size());
		for (uint32_t i = 0; i < constant_type.member_types.size(); i++)
		{
			make_constant_null(member_ids + i, constant_type.member_types[i], add_to_typed_id_set);
			elements[i] = member_ids + i;
		}

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false).self = id;
	}
	else
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
}